

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map_Chest::Update(Map_Chest *this,Map *map,Character *exclude)

{
  undefined2 uVar1;
  undefined4 num;
  Character *this_00;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference pMVar5;
  reference ppCVar6;
  Character *character;
  iterator __end1_1;
  iterator __begin1_1;
  list<Character_*,_std::allocator<Character_*>_> *__range1_1;
  short local_78;
  int iStack_74;
  Map_Chest_Item item;
  const_iterator __end1;
  const_iterator __begin1;
  list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *__range1;
  PacketBuilder builder;
  Character *exclude_local;
  Map *map_local;
  Map_Chest *this_local;
  
  builder.add_size = (size_t)exclude;
  sVar4 = std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::size(&this->items);
  PacketBuilder::PacketBuilder((PacketBuilder *)&__range1,PACKET_CHEST,PACKET_AGREE,sVar4 * 5);
  __end1 = std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::begin(&this->items);
  register0x00000000 =
       std::__cxx11::list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>::end(&this->items);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&item.slot), bVar2) {
    pMVar5 = std::_List_const_iterator<Map_Chest_Item>::operator*(&__end1);
    item._0_4_ = pMVar5->slot;
    uVar1 = pMVar5->id;
    num = pMVar5->amount;
    PacketBuilder::AddShort((PacketBuilder *)&__range1,(int)(short)uVar1);
    PacketBuilder::AddThree((PacketBuilder *)&__range1,num);
    std::_List_const_iterator<Map_Chest_Item>::operator++(&__end1);
  }
  __end1_1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(&map->characters);
  character = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(&map->characters);
  while (bVar2 = std::operator!=(&__end1_1,(_Self *)&character), bVar2) {
    ppCVar6 = std::_List_iterator<Character_*>::operator*(&__end1_1);
    this_00 = *ppCVar6;
    if ((this_00 != (Character *)builder.add_size) &&
       (iVar3 = util::path_length((uint)this_00->x,(uint)this_00->y,(uint)this->x,(uint)this->y),
       iVar3 < 2)) {
      Character::Send(this_00,(PacketBuilder *)&__range1);
    }
    std::_List_iterator<Character_*>::operator++(&__end1_1);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)&__range1);
  return;
}

Assistant:

void Map_Chest::Update(Map *map, Character *exclude) const
{
	PacketBuilder builder(PACKET_CHEST, PACKET_AGREE, this->items.size() * 5);

	UTIL_FOREACH(this->items, item)
	{
		builder.AddShort(item.id);
		builder.AddThree(item.amount);
	}

	UTIL_FOREACH(map->characters, character)
	{
		if (character == exclude)
		{
			continue;
		}

		if (util::path_length(character->x, character->y, this->x, this->y) <= 1)
		{
			character->Send(builder);
		}
	}
}